

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

int __thiscall CPU::init(CPU *this,EVP_PKEY_CTX *ctx)

{
  uint16_t uVar1;
  int extraout_EAX;
  Memory *this_00;
  Memory *pMVar2;
  Console *c;
  uint16_t addr;
  
  this_00 = (Memory *)Console::Instance();
  pMVar2 = Console::getMemory((Console *)this_00);
  this->m = pMVar2;
  addr = (uint16_t)((ulong)this >> 0x30);
  uVar1 = (uint16_t)((ulong)this >> 0x20);
  Memory::Write16(this_00,addr,uVar1);
  Memory::Write16(this_00,addr,uVar1);
  Memory::Write16(this_00,addr,uVar1);
  Memory::Write16(this_00,addr,uVar1);
  uVar1 = Memory::Read16(this_00,addr);
  setPC(this,uVar1);
  return extraout_EAX;
}

Assistant:

void CPU::init() {
	Console &c = Console::Instance();
	m = c.getMemory();

	m->Write16(0x0008, 0xF7);
	m->Write16(0x0009, 0xEF);
	m->Write16(0x000A, 0xDF);
	m->Write16(0x000F, 0xBF);
	setPC(m->Read16(0xFFFC));
}